

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdblobimpl.h
# Opt level: O0

SQInteger __thiscall SQBlob::Write(SQBlob *this,void *buffer,SQInteger size)

{
  bool bVar1;
  SQInteger size_local;
  void *buffer_local;
  SQBlob *this_local;
  
  bVar1 = CanAdvance(this,size);
  if (!bVar1) {
    GrowBufOf(this,(this->_ptr + size) - this->_size);
  }
  memcpy(this->_buf + this->_ptr,buffer,size);
  this->_ptr = size + this->_ptr;
  return size;
}

Assistant:

SQInteger Write(void *buffer, SQInteger size) {
        if(!CanAdvance(size)) {
            GrowBufOf(_ptr + size - _size);
        }
        memcpy(&_buf[_ptr], buffer, size);
        _ptr += size;
        return size;
    }